

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

Var __thiscall
Js::JSONStringifier::CallReplacerFunction
          (JSONStringifier *this,RecyclableObject *holder,JavascriptString *key,Var value)

{
  bool bVar1;
  ThreadContext *pTVar2;
  RecyclableObject *this_00;
  JavascriptMethod entryPoint;
  Var pvVar3;
  Arguments local_48;
  RecyclableObject *local_38;
  Var values [3];
  
  pTVar2 = this->scriptContext->threadContext;
  bVar1 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  this_00 = this->replacerFunction;
  local_38 = holder;
  values[0] = key;
  values[1] = value;
  entryPoint = RecyclableObject::GetEntryPoint(this_00);
  local_48.Info = (Type)0x3;
  local_48.Values = &local_38;
  pvVar3 = JavascriptFunction::CallFunction<true>(this_00,entryPoint,&local_48,false);
  pTVar2->reentrancySafeOrHandled = bVar1;
  return pvVar3;
}

Assistant:

Var
JSONStringifier::CallReplacerFunction(_In_opt_ RecyclableObject* holder, _In_ JavascriptString* key, _In_ Var value)
{
    Var values[3];
    Arguments args(0, values);

    args.Info.Count = 3;
    args.Values[0] = holder;
    args.Values[1] = key;
    args.Values[2] = value;

    BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
    {
        return JavascriptFunction::CallFunction<true>(this->replacerFunction, this->replacerFunction->GetEntryPoint(), args);
    }
    END_SAFE_REENTRANT_CALL;
}